

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m68kops.c
# Opt level: O1

void m68k_op_not_8_pd(void)

{
  uint uVar1;
  uint uVar2;
  uint addr_in;
  
  addr_in = m68ki_cpu.dar[(ulong)(m68ki_cpu.ir & 7) + 8] - 1;
  m68ki_cpu.dar[(ulong)(m68ki_cpu.ir & 7) + 8] = addr_in;
  my_fc_handler(m68ki_address_space | m68ki_cpu.s_flag);
  uVar1 = addr_in;
  if (m68ki_cpu.pmmu_enabled != 0) {
    uVar1 = pmmu_translate_addr(addr_in);
  }
  uVar2 = m68k_read_memory_8(uVar1 & m68ki_cpu.address_mask);
  my_fc_handler(m68ki_cpu.s_flag | 1);
  if (m68ki_cpu.pmmu_enabled != 0) {
    addr_in = pmmu_translate_addr(addr_in);
  }
  uVar2 = ~uVar2 & 0xff;
  m68k_write_memory_8(addr_in & m68ki_cpu.address_mask,uVar2);
  m68ki_cpu.n_flag = uVar2;
  m68ki_cpu.not_z_flag = uVar2;
  m68ki_cpu.v_flag = 0;
  m68ki_cpu.c_flag = 0;
  return;
}

Assistant:

static void m68k_op_not_8_pd(void)
{
	uint ea = EA_AY_PD_8();
	uint res = MASK_OUT_ABOVE_8(~m68ki_read_8(ea));

	m68ki_write_8(ea, res);

	FLAG_N = NFLAG_8(res);
	FLAG_Z = res;
	FLAG_C = CFLAG_CLEAR;
	FLAG_V = VFLAG_CLEAR;
}